

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O0

bool __thiscall
PSEngine::does_move_info_matches_rule
          (PSEngine *this,ObjectMoveType p_move_type,EntityRuleInfo p_rule_info,
          AbsoluteDirection p_rule_dir)

{
  bool bVar1;
  set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
  *psVar2;
  size_type sVar3;
  _Self local_b0;
  _Self local_a8;
  undefined4 local_a0;
  undefined1 local_90 [8];
  set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
  allowed_move_types;
  optional<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>_>
  move_types_opt;
  AbsoluteDirection p_rule_dir_local;
  EntityRuleInfo p_rule_info_local;
  ObjectMoveType p_move_type_local;
  PSEngine *this_local;
  
  if (p_rule_info == None) {
    this_local._7_1_ = 1;
  }
  else {
    p_rule_dir_local = p_move_type;
    _p_rule_info_local = this;
    if (p_rule_info == No) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/KerDelos[P]Psionic/src/PSEngine.cpp"
                    ,0x1d0,
                    "bool PSEngine::does_move_info_matches_rule(ObjectMoveType, CompiledGame::EntityRuleInfo, AbsoluteDirection)"
                   );
    }
    convert_entity_rule_info_to_allowed_move_types
              ((optional<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>_>
                *)&allowed_move_types._M_t._M_impl.super__Rb_tree_header._M_node_count,this,
               p_rule_info,p_rule_dir);
    bVar1 = std::
            optional<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>_>
            ::has_value((optional<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>_>
                         *)&allowed_move_types._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (!bVar1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/KerDelos[P]Psionic/src/PSEngine.cpp"
                    ,0x1e7,
                    "bool PSEngine::does_move_info_matches_rule(ObjectMoveType, CompiledGame::EntityRuleInfo, AbsoluteDirection)"
                   );
    }
    psVar2 = std::
             optional<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>_>
             ::value((optional<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>_>
                      *)&allowed_move_types._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
    ::set((set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
           *)local_90,psVar2);
    sVar3 = std::
            set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
            ::size((set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
                    *)local_90);
    if (sVar3 == 0) {
      this_local._7_1_ = p_rule_dir_local == (Right|Down);
    }
    else {
      local_a8._M_node =
           (_Base_ptr)
           std::
           set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
           ::find((set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
                   *)local_90,&p_rule_dir_local);
      local_b0._M_node =
           (_Base_ptr)
           std::
           set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
           ::end((set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
                  *)local_90);
      this_local._7_1_ = std::operator!=(&local_a8,&local_b0);
    }
    local_a0 = 1;
    std::
    set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
    ::~set((set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
            *)local_90);
    std::
    optional<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>_>
    ::~optional((optional<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>_>
                 *)&allowed_move_types._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool PSEngine::does_move_info_matches_rule(ObjectMoveType p_move_type, CompiledGame::EntityRuleInfo p_rule_info, AbsoluteDirection p_rule_dir)
{
    if(p_rule_info == CompiledGame::EntityRuleInfo::None)
    {
        return true;
    }
    else if( p_rule_info == CompiledGame::EntityRuleInfo::No)
    {
        assert(false);
        PS_LOG_ERROR("should not happen");
        return false;
    }
    else
    {
        optional<set<ObjectMoveType>> move_types_opt = convert_entity_rule_info_to_allowed_move_types(p_rule_info,p_rule_dir);

        if(move_types_opt.has_value())
        {
            set<PSEngine::ObjectMoveType>allowed_move_types = move_types_opt.value();

            if(allowed_move_types.size() == 0)
            {
                return p_move_type == PSEngine::ObjectMoveType::Stationary;
            }
            else
            {
                return allowed_move_types.find(p_move_type) != allowed_move_types.end();
            }
        }
        else
        {
            assert(false);
            PS_LOG_ERROR("should not happen");
            return false;
        }
    }
}